

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

string * __thiscall
duckdb::Node::VerifyAndToString_abi_cxx11_
          (string *__return_storage_ptr__,Node *this,ART *art,bool only_verify)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  NType type;
  bool bVar3;
  idx_t __val;
  unsafe_optional_ptr<Node> this_00;
  undefined8 *puVar4;
  long *plVar5;
  NType NVar6;
  undefined7 in_register_00000009;
  size_type *psVar7;
  ulong uVar8;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  uint uVar12;
  char cVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  bool in_R8B;
  uint uVar16;
  uint8_t byte;
  string __str;
  string str;
  string __str_1;
  byte local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ART *local_f8;
  string local_f0;
  uint local_cc;
  Node *local_c8;
  uint local_bc;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  uVar11 = (this->super_IndexPointer).data;
  NVar6 = (NType)(uVar11 >> 0x38);
  type = NVar6 & 0x7f;
  local_f8 = art;
  if (type == PREFIX) {
    Prefix::VerifyAndToString_abi_cxx11_
              (&local_f0,(Prefix *)art,(ART *)this,(Node *)(ulong)only_verify,in_R8B);
    if ((long)(this->super_IndexPointer).data < 0) {
      ::std::operator+(&local_118,"Gate [ ",&local_f0);
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_118);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_138.field_2._M_allocated_capacity = *psVar7;
        local_138.field_2._8_8_ = plVar5[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar7;
        local_138._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_138._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
    }
    if (only_verify) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,anon_var_dwarf_6372561 + 9);
    }
    else {
      ::std::operator+(__return_storage_ptr__,anon_var_dwarf_637249a + 8,&local_f0);
    }
  }
  else {
    NVar6 = NVar6 & 0x7f;
    if (NVar6 == LEAF) {
      Leaf::DeprecatedVerifyAndToString_abi_cxx11_
                (__return_storage_ptr__,(Leaf *)art,(ART *)this,(Node *)(ulong)only_verify,in_R8B);
      return __return_storage_ptr__;
    }
    if (NVar6 == LEAF_INLINED) {
      if (only_verify) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,anon_var_dwarf_6372561 + 9);
        return __return_storage_ptr__;
      }
      uVar11 = uVar11 & 0xffffffffffffff;
      uVar12 = 1;
      if (9 < uVar11) {
        uVar8 = uVar11;
        uVar16 = 4;
        do {
          uVar12 = uVar16;
          if (uVar8 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_016e8718;
          }
          if (uVar8 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_016e8718;
          }
          if (uVar8 < 10000) goto LAB_016e8718;
          bVar3 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
          uVar16 = uVar12 + 4;
        } while (bVar3);
        uVar12 = uVar12 + 1;
      }
LAB_016e8718:
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_138,(char)uVar12);
      ::std::__detail::__to_chars_10_impl<unsigned_long>(local_138._M_dataplus._M_p,uVar12,uVar11);
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x1e0ba8b);
      psVar7 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_f0.field_2._M_allocated_capacity = *psVar7;
        local_f0.field_2._8_8_ = puVar4[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar7;
        local_f0._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_f0._M_string_length = puVar4[1];
      *puVar4 = psVar7;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_f0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        lVar2 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      _Var15._M_p = local_138._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == &local_138.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_016e86f7;
    }
    local_58 = __return_storage_ptr__;
    __val = GetCapacity(type);
    cVar13 = '\x01';
    if (9 < __val) {
      cVar13 = '\x03' - (__val < 100);
    }
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_118,cVar13);
    ::std::__detail::__to_chars_10_impl<unsigned_long>
              (local_118._M_dataplus._M_p,(uint)local_118._M_string_length,__val);
    puVar4 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x1dee525);
    paVar1 = &local_138.field_2;
    psVar7 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_138.field_2._M_allocated_capacity = *psVar7;
      local_138.field_2._8_8_ = puVar4[3];
      local_138._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar7;
      local_138._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_138._M_string_length = puVar4[1];
    *puVar4 = psVar7;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_138);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    psVar7 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_f0.field_2._M_allocated_capacity = *psVar7;
      local_f0.field_2._8_8_ = puVar4[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar7;
      local_f0._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_f0._M_string_length = puVar4[1];
    *puVar4 = psVar7;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    local_139 = 0;
    local_cc = (uint)CONCAT71(in_register_00000009,only_verify);
    local_c8 = this;
    if ((byte)((*(byte *)((long)&(this->super_IndexPointer).data + 7) & 0x7f) - 8) < 3) {
      ::std::operator+(&local_138,"Leaf ",&local_f0);
      ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      bVar3 = GetNextByte(this,local_f8,&local_139);
      while (bVar3 != false) {
        uVar12 = (uint)local_139;
        uVar16 = 3 - (local_139 < 100);
        if (local_139 < 10) {
          uVar16 = 1;
        }
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar16);
        ::std::__detail::__to_chars_10_impl<unsigned_int>(local_118._M_dataplus._M_p,uVar16,uVar12);
        puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        psVar7 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_138.field_2._M_allocated_capacity = *psVar7;
          local_138.field_2._8_8_ = puVar4[3];
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar7;
          local_138._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_138._M_string_length = puVar4[1];
        *puVar4 = psVar7;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_138._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if (local_139 == 0xff) break;
        local_139 = local_139 + 1;
        bVar3 = GetNextByte(local_c8,local_f8,&local_139);
      }
    }
    else {
      this_00 = GetNextChildInternal<duckdb::Node_const>(local_f8,this,&local_139);
      local_bc = local_cc & 0xff;
      while (this_00.ptr != (Node *)0x0) {
        uVar16 = (uint)local_139;
        uVar12 = 3 - (local_139 < 100);
        if (local_139 < 10) {
          uVar12 = 1;
        }
        local_50[0] = local_40;
        ::std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar12);
        ::std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],uVar12,uVar16);
        plVar5 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1e0f04c);
        local_78 = &local_68;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_68 = *plVar9;
          lStack_60 = plVar5[3];
        }
        else {
          local_68 = *plVar9;
          local_78 = (long *)*plVar5;
        }
        local_70 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)::std::__cxx11::string::append((char *)&local_78);
        puVar10 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar10) {
          local_a8 = *puVar10;
          lStack_a0 = plVar5[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *puVar10;
          local_b8 = (ulong *)*plVar5;
        }
        local_b0 = plVar5[1];
        *plVar5 = (long)puVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        VerifyAndToString_abi_cxx11_(&local_98,this_00.ptr,local_f8,SUB41(local_bc,0));
        uVar11 = 0xf;
        if (local_b8 != &local_a8) {
          uVar11 = local_a8;
        }
        if (uVar11 < local_98._M_string_length + local_b0) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            uVar14 = local_98.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_98._M_string_length + local_b0) goto LAB_016e8378;
          puVar4 = (undefined8 *)
                   ::std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
        }
        else {
LAB_016e8378:
          puVar4 = (undefined8 *)
                   ::std::__cxx11::string::_M_append
                             ((char *)&local_b8,(ulong)local_98._M_dataplus._M_p);
        }
        psVar7 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_118.field_2._M_allocated_capacity = *psVar7;
          local_118.field_2._8_8_ = puVar4[3];
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        }
        else {
          local_118.field_2._M_allocated_capacity = *psVar7;
          local_118._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_118._M_string_length = puVar4[1];
        *puVar4 = psVar7;
        puVar4[1] = 0;
        *(undefined1 *)psVar7 = 0;
        puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
        psVar7 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_138.field_2._M_allocated_capacity = *psVar7;
          local_138.field_2._8_8_ = puVar4[3];
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar7;
          local_138._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_138._M_string_length = puVar4[1];
        *puVar4 = psVar7;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_138._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (local_139 == 0xff) break;
        local_139 = local_139 + 1;
        this_00 = GetNextChildInternal<duckdb::Node_const>(local_f8,local_c8,&local_139);
      }
    }
    __return_storage_ptr__ = local_58;
    uVar12 = local_cc;
    if ((long)(local_c8->super_IndexPointer).data < 0) {
      ::std::operator+(&local_118,"Gate [ ",&local_f0);
      puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
      psVar7 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_138.field_2._M_allocated_capacity = *psVar7;
        local_138.field_2._8_8_ = puVar4[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar7;
        local_138._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_138._M_string_length = puVar4[1];
      *puVar4 = psVar7;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
    }
    if ((char)uVar12 == '\0') {
      ::std::operator+(&local_138,anon_var_dwarf_637249a + 8,&local_f0);
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_138);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        lVar2 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,anon_var_dwarf_6372561 + 9);
    }
  }
  _Var15._M_p = local_f0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
    return __return_storage_ptr__;
  }
LAB_016e86f7:
  operator_delete(_Var15._M_p);
  return __return_storage_ptr__;
}

Assistant:

string Node::VerifyAndToString(ART &art, const bool only_verify) const {
	D_ASSERT(HasMetadata());

	auto type = GetType();
	switch (type) {
	case NType::LEAF_INLINED:
		return only_verify ? "" : "Inlined Leaf [row ID: " + to_string(GetRowId()) + "]";
	case NType::LEAF:
		return Leaf::DeprecatedVerifyAndToString(art, *this, only_verify);
	case NType::PREFIX: {
		auto str = Prefix::VerifyAndToString(art, *this, only_verify);
		if (GetGateStatus() == GateStatus::GATE_SET) {
			str = "Gate [ " + str + " ]";
		}
		return only_verify ? "" : "\n" + str;
	}
	default:
		break;
	}

	string str = "Node" + to_string(GetCapacity(type)) + ": [ ";
	uint8_t byte = 0;

	if (IsLeafNode()) {
		str = "Leaf " + str;
		auto has_byte = GetNextByte(art, byte);
		while (has_byte) {
			str += to_string(byte) + "-";
			if (byte == NumericLimits<uint8_t>::Maximum()) {
				break;
			}
			byte++;
			has_byte = GetNextByte(art, byte);
		}
	} else {
		auto child = GetNextChild(art, byte);
		while (child) {
			str += "(" + to_string(byte) + ", " + child->VerifyAndToString(art, only_verify) + ")";
			if (byte == NumericLimits<uint8_t>::Maximum()) {
				break;
			}
			byte++;
			child = GetNextChild(art, byte);
		}
	}

	if (GetGateStatus() == GateStatus::GATE_SET) {
		str = "Gate [ " + str + " ]";
	}
	return only_verify ? "" : "\n" + str + "]";
}